

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O1

void Pf_StoPrint(Pf_Man_t *p,int fVerbose)

{
  Vec_Int_t *pVVar1;
  Vec_Wec_t *pVVar2;
  long lVar3;
  int i;
  ulong uVar4;
  ulong local_40;
  
  pVVar2 = p->vTt2Match;
  local_40 = 0;
  if (2 < pVVar2->nSize) {
    local_40 = 0;
    uVar4 = 2;
    do {
      pVVar1 = pVVar2->pArray;
      if (1 < pVVar1[uVar4].nSize) {
        lVar3 = 1;
        i = 0;
        do {
          if (uVar4 < 10 && fVerbose != 0) {
            Pf_StoPrintOne(p,(int)local_40 + i + 1,(int)uVar4,i,pVVar1[uVar4].pArray[lVar3 + -1],
                           *(Pf_Mat_t *)(pVVar1[uVar4].pArray + lVar3));
          }
          lVar3 = lVar3 + 2;
          i = i + 1;
        } while ((int)lVar3 < pVVar1[uVar4].nSize);
        local_40 = (ulong)(uint)((int)local_40 + i);
      }
      uVar4 = uVar4 + 1;
      pVVar2 = p->vTt2Match;
    } while ((long)uVar4 < (long)pVVar2->nSize);
  }
  printf("Gates = %d.  Truths = %d.  Matches = %d.\n",(ulong)(uint)p->nCells,
         (ulong)(uint)p->vTtMem->nEntries,local_40);
  return;
}

Assistant:

void Pf_StoPrint( Pf_Man_t * p, int fVerbose )
{
    int t, i, GateId, Entry, Count = 0;
    for ( t = 2; t < Vec_WecSize(p->vTt2Match); t++ )
    {
        Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, t );
        Vec_IntForEachEntryDouble( vArr, GateId, Entry, i )
        {
            Count++;
            if ( !fVerbose )
                continue;
            if ( t < 10 )
                Pf_StoPrintOne( p, Count, t, i/2, GateId, Pf_Int2Mat(Entry) );
        }
    }
    printf( "Gates = %d.  Truths = %d.  Matches = %d.\n", 
        p->nCells, Vec_MemEntryNum(p->vTtMem), Count );
}